

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QString>::move(QList<QString> *this,qsizetype from,qsizetype to)

{
  long in_RDX;
  long in_RSI;
  QArrayDataPointer<QString> *in_RDI;
  QString *unaff_retaddr;
  QString *b;
  QArrayDataPointer<QString> *__last;
  
  if (in_RSI != in_RDX) {
    __last = in_RDI;
    detach((QList<QString> *)0x8bcd1a);
    QArrayDataPointer<QString>::operator->(in_RDI);
    QArrayDataPointer<QString>::begin((QArrayDataPointer<QString> *)0x8bcd2b);
    if (in_RSI < in_RDX) {
      std::_V2::rotate<QString*>(b,unaff_retaddr,(QString *)__last);
    }
    else {
      std::_V2::rotate<QString*>(b,unaff_retaddr,(QString *)__last);
    }
  }
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }